

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O3

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Vec3<int>_>::writeValueTo
          (TypedAttribute<Imath_2_5::Vec3<int>_> *this,OStream *os,int version)

{
  int local_1c;
  int local_18;
  int local_14;
  
  local_1c = (this->_value).x;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_18 = (this->_value).y;
  (*os->_vptr_OStream[2])(os,&local_18,4);
  local_14 = (this->_value).z;
  (*os->_vptr_OStream[2])(os,&local_14,4);
  return;
}

Assistant:

void
V3iAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value.x);
    Xdr::write <StreamIO> (os, _value.y);
    Xdr::write <StreamIO> (os, _value.z);
}